

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::pwrDeriv(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *peVar2;
  expr_node *new_pwr;
  expr_node *deriv;
  expr_value local_50;
  expr_value local_48;
  expr_node *local_40;
  expr_value local_38 [3];
  expr_value local_20;
  expr_node *local_18;
  
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_20,3);
  expr_node::expr_node(peVar1,'\x05',&local_20);
  local_18 = peVar1;
  peVar2 = Copy(peVar1);
  local_18->left = peVar2;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)local_38,5);
  expr_node::expr_node(peVar2,'\x05',local_38);
  local_18->right = peVar2;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_48,2);
  expr_node::expr_node(peVar2,'\x05',&local_48);
  local_40 = peVar2;
  peVar2 = Copy(peVar1);
  local_40->left = peVar2;
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_50,1);
  expr_node::expr_node(peVar2,'\x01',&local_50);
  local_40->right = peVar2;
  Link(local_40,local_40->left,local_40->right);
  local_18->right->right = local_40;
  peVar1 = Copy(peVar1);
  local_18->right->left = peVar1;
  Link(local_18->right,local_18->right->left,local_18->right->right);
  Link(local_18,local_18->left,local_18->right);
  return local_18;
}

Assistant:

expr_node* expr_tree::pwrDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)MUL);
    deriv->left = Copy(node->right);
    deriv->right = new expr_node(OP, (long)PWR);
    auto new_pwr = new expr_node(OP, (long)SUB);
    new_pwr->left = Copy(node->right);
    new_pwr->right = new expr_node(INT, (long)1);
    Link(new_pwr, new_pwr->left, new_pwr->right);
    deriv->right->right = new_pwr;
    deriv->right->left = Copy(node->left);
    Link(deriv->right, deriv->right->left, deriv->right->right);
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}